

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_sdl2.cpp
# Opt level: O0

void ImGui_ImplSDL2_UpdateGamepadAnalog
               (ImGui_ImplSDL2_Data *bd,ImGuiIO *io,ImGuiKey key,SDL_GameControllerAxis axis_no,
               float v0,float v1)

{
  short sVar1;
  _SDL_GameController **pp_Var2;
  undefined4 in_ECX;
  long in_RDI;
  float in_XMM0_Da;
  float fVar3;
  float in_XMM1_Da;
  float unaff_retaddr;
  bool in_stack_0000000b;
  float vn;
  SDL_GameController *gamepad;
  _SDL_GameController **__end1;
  _SDL_GameController **__begin1;
  ImVector<_SDL_GameController_*> *__range1;
  float merged_value;
  _SDL_GameController **local_38;
  float local_24;
  
  local_24 = 0.0;
  local_38 = ImVector<_SDL_GameController_*>::begin
                       ((ImVector<_SDL_GameController_*> *)(in_RDI + 0x80));
  pp_Var2 = ImVector<_SDL_GameController_*>::end((ImVector<_SDL_GameController_*> *)(in_RDI + 0x80))
  ;
  for (; local_38 != pp_Var2; local_38 = local_38 + 1) {
    sVar1 = SDL_GameControllerGetAxis(*local_38,in_ECX);
    fVar3 = Saturate(((float)(int)sVar1 - in_XMM0_Da) / (in_XMM1_Da - in_XMM0_Da));
    if (local_24 < fVar3) {
      local_24 = fVar3;
    }
  }
  ImGuiIO::AddKeyAnalogEvent((ImGuiIO *)gamepad,(ImGuiKey)vn,in_stack_0000000b,unaff_retaddr);
  return;
}

Assistant:

static void ImGui_ImplSDL2_UpdateGamepadAnalog(ImGui_ImplSDL2_Data* bd, ImGuiIO& io, ImGuiKey key, SDL_GameControllerAxis axis_no, float v0, float v1)
{
    float merged_value = 0.0f;
    for (SDL_GameController* gamepad : bd->Gamepads)
    {
        float vn = Saturate((float)(SDL_GameControllerGetAxis(gamepad, axis_no) - v0) / (float)(v1 - v0));
        if (merged_value < vn)
            merged_value = vn;
    }
    io.AddKeyAnalogEvent(key, merged_value > 0.1f, merged_value);
}